

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

void __thiscall ArgsManager::CheckMultipleCLIArgs(ArgsManager *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  unique_lock<std::recursive_mutex> local_88;
  char local_78 [32];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._M_owns = false;
  local_88._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_88);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(this->m_available_args)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (_Base_ptr)args;
    do {
      if (0xc < (int)p_Var2[1]._M_color) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < 0xd];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var4 != (_Base_ptr)args) && ((int)p_Var4[1]._M_color < 0xe)) {
      p_Var3 = *(_Rb_tree_node_base **)(p_Var4 + 2);
      if (p_Var3 != (_Rb_tree_node_base *)&p_Var4[1]._M_left) {
        do {
          bVar1 = IsArgSet(this,(string *)(p_Var3 + 1));
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_a8,(value_type *)(p_Var3 + 1));
          }
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        } while (p_Var3 != (_Rb_tree_node_base *)&p_Var4[1]._M_left);
        if (0x20 < (ulong)((long)local_a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          util::
          Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
                    (local_78,(util *)&local_a8,", ");
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)"Only one of %s may be specified.",local_78,args);
          std::runtime_error::runtime_error(this_00,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_001427ed;
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001427ed:
  __stack_chk_fail();
}

Assistant:

void ArgsManager::CheckMultipleCLIArgs() const
{
    LOCK(cs_args);
    std::vector<std::string> found{};
    auto cmds = m_available_args.find(OptionsCategory::CLI_COMMANDS);
    if (cmds != m_available_args.end()) {
        for (const auto& [cmd, argspec] : cmds->second) {
            if (IsArgSet(cmd)) {
                found.push_back(cmd);
            }
        }
        if (found.size() > 1) {
            throw std::runtime_error(strprintf("Only one of %s may be specified.", util::Join(found, ", ")));
        }
    }
}